

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  TokenType TVar4;
  bool bVar5;
  _Elt_pointer ppVVar6;
  allocator<char> local_f1;
  Value numberName;
  String name;
  Token colon;
  Token comma;
  Value init;
  Token tokenName;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  Value::Value(&init,objectValue);
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar2 = &ppVVar6[-1]->value_;
  aVar1 = *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1);
  *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1) = init.bits_;
  VVar3 = *pVVar2;
  *pVVar2 = init.value_;
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar6[-1]->start_ = (long)token->start_ - (long)this->begin_;
  init.value_ = VVar3;
  init.bits_ = aVar1;
  do {
    bVar5 = readToken(this,&tokenName);
    if (!bVar5) {
LAB_0010a028:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \'}\' or object member name",
                 (allocator<char> *)&colon);
      addErrorAndRecover(this,(String *)&numberName,&tokenName,tokenObjectEnd);
LAB_0010a0f0:
      std::__cxx11::string::~string((string *)&numberName);
LAB_0010a0fa:
      bVar5 = false;
      goto LAB_0010a0fc;
    }
    bVar5 = true;
    while ((TVar4 = tokenName.type_, bVar5 != false && (tokenName.type_ == tokenComment))) {
      bVar5 = readToken(this,&tokenName);
    }
    if (bVar5 == false) goto LAB_0010a028;
    if (tokenName.type_ == tokenObjectEnd) {
      bVar5 = true;
      if ((name._M_string_length != 0) && ((this->features_).allowTrailingCommas_ == false)) {
        name._M_string_length = 0;
        *name._M_dataplus._M_p = '\0';
        goto LAB_0010a028;
      }
      goto LAB_0010a0fc;
    }
    name._M_string_length = 0;
    *name._M_dataplus._M_p = '\0';
    if (TVar4 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ != true) goto LAB_0010a028;
      Value::Value(&numberName,nullValue);
      bVar5 = decodeNumber(this,&tokenName,&numberName);
      if (bVar5) {
        Value::asString_abi_cxx11_((String *)&colon,&numberName);
        std::__cxx11::string::operator=((string *)&name,(string *)&colon);
        std::__cxx11::string::~string((string *)&colon);
      }
      else {
        recoverFromError(this,tokenObjectEnd);
      }
      Value::~Value(&numberName);
      if (bVar5) goto LAB_00109ec6;
      goto LAB_0010a0fa;
    }
    if (TVar4 != tokenString) goto LAB_0010a028;
    bVar5 = decodeString(this,&tokenName,&name);
    if (!bVar5) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010a0fa;
    }
LAB_00109ec6:
    if (0x3fffffff < name._M_string_length) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"keylength >= 2^30",(allocator<char> *)&colon);
      throwRuntimeError((String *)&numberName);
    }
    if ((this->features_).rejectDupKeys_ == true) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar6 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      bVar5 = Value::isMember(ppVVar6[-1],&name);
      if (!bVar5) goto LAB_00109f0e;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colon,
                     "Duplicate key: \'",&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numberName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colon,
                     "\'");
      std::__cxx11::string::~string((string *)&colon);
      addErrorAndRecover(this,(String *)&numberName,&tokenName,tokenObjectEnd);
      goto LAB_0010a0f0;
    }
LAB_00109f0e:
    bVar5 = readToken(this,&colon);
    if (!bVar5 || colon.type_ != tokenMemberSeparator) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \':\' after object member name",
                 (allocator<char> *)&comma);
      addErrorAndRecover(this,(String *)&numberName,&colon,tokenObjectEnd);
      goto LAB_0010a0f0;
    }
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar6 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    numberName.value_.map_ = (ObjectValues *)Value::operator[](ppVVar6[-1],&name);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&numberName);
    bVar5 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar5) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010a0fa;
    }
    bVar5 = readToken(this,&comma);
    if (((!bVar5) || (tokenComment < comma.type_)) ||
       ((0xa004U >> (comma.type_ & (tokenError|tokenComment)) & 1) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \',\' or \'}\' in object declaration",&local_f1);
      addErrorAndRecover(this,(String *)&numberName,&comma,tokenObjectEnd);
      goto LAB_0010a0f0;
    }
    bVar5 = true;
    while ((bVar5 != false && (comma.type_ == tokenComment))) {
      bVar5 = readToken(this,&comma);
    }
  } while (comma.type_ != tokenObjectEnd);
  bVar5 = true;
LAB_0010a0fc:
  Value::~Value(&init);
  std::__cxx11::string::~string((string *)&name);
  return bVar5;
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}